

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_address.cpp
# Opt level: O1

int CfdGetPeginAddress(void *handle,int mainchain_network_type,char *fedpeg_script,int hash_type,
                      char *pubkey,char *redeem_script,char **pegin_address,char **claim_script,
                      char **tweaked_fedpeg_script)

{
  pointer *ppuVar1;
  Script *pSVar2;
  bool bVar3;
  AddressType address_type;
  size_t sVar4;
  CfdException *pCVar5;
  char *work_script;
  char *work_address;
  char *work_fedpeg_script;
  Script tweak_fedpegscript;
  Script claim_script_obj;
  Address addr;
  allocator local_29a;
  bool local_299;
  Script local_298;
  char *local_260;
  NetType local_254;
  Script local_250;
  ByteData local_218;
  string local_200;
  Script local_1e0;
  undefined1 local_1a8 [32];
  uchar local_188 [16];
  pointer local_178;
  pointer local_160;
  pointer local_148;
  TapBranch local_130;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_b8;
  Script local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_298.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_260 = (char *)0x0;
  local_298.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)handle;
  cfd::Initialize();
  if (pegin_address == (char **)0x0) {
    local_1a8._0_8_ = "cfdcapi_elements_address.cpp";
    local_1a8._8_4_ = 0xaa;
    local_1a8._16_8_ = "CfdGetPeginAddress";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_1a8,kCfdLogLevelWarning,"pegin_address is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Failed to parameter. pegin_address is null.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_1a8);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (pubkey == (char *)0x0 && redeem_script == (char *)0x0) {
    local_1a8._0_8_ = "cfdcapi_elements_address.cpp";
    local_1a8._8_4_ = 0xb0;
    local_1a8._16_8_ = "CfdGetPeginAddress";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_1a8,kCfdLogLevelWarning,"pubkey and script is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Failed to parameter. pubkey and script is null.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_1a8);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (claim_script == (char **)0x0) {
    local_1a8._0_8_ = "cfdcapi_elements_address.cpp";
    local_1a8._8_4_ = 0xb6;
    local_1a8._16_8_ = "CfdGetPeginAddress";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_1a8,kCfdLogLevelWarning,"claim_script is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Failed to parameter. claim_script is null.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_1a8);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar3 = cfd::capi::IsEmptyString(fedpeg_script);
  if (bVar3) {
    local_1a8._0_8_ = "cfdcapi_elements_address.cpp";
    local_1a8._8_4_ = 0xbc;
    local_1a8._16_8_ = "CfdGetPeginAddress";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_1a8,kCfdLogLevelWarning,"fedpeg_script is null or empty.")
    ;
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Failed to parameter. fedpeg_script is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_1a8);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_299 = false;
  local_254 = cfd::capi::ConvertNetType(mainchain_network_type,&local_299);
  if (local_299 == false) {
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Invalid network type. need mainchain network type.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)local_1a8);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  address_type = cfd::capi::ConvertHashToAddressType(0);
  cfd::core::Script::Script(&local_1e0);
  if (pubkey == (char *)0x0) {
    bVar3 = false;
  }
  else {
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    sVar4 = strlen(pubkey);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,pubkey,pubkey + sVar4);
    cfd::core::ByteData::ByteData(&local_218,&local_200);
    bVar3 = cfd::core::Pubkey::IsValid(&local_218);
    if (local_218.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_218.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p);
    }
  }
  if (bVar3 == false) {
    std::__cxx11::string::string((string *)&local_298,redeem_script,&local_29a);
    cfd::core::Script::Script(&local_250,(string *)&local_298);
    cfd::core::ScriptUtil::CreateP2wshLockingScript((Script *)local_1a8,&local_250);
    cfd::core::Script::operator=(&local_1e0,(Script *)local_1a8);
    cfd::core::Script::~Script((Script *)local_1a8);
    cfd::core::Script::~Script(&local_250);
    pSVar2 = &local_298;
  }
  else {
    std::__cxx11::string::string((string *)&local_250,pubkey,&local_29a);
    cfd::core::Pubkey::Pubkey((Pubkey *)&local_298,(string *)&local_250);
    cfd::core::ScriptUtil::CreateP2wpkhLockingScript((Script *)local_1a8,(Pubkey *)&local_298);
    cfd::core::Script::operator=(&local_1e0,(Script *)local_1a8);
    cfd::core::Script::~Script((Script *)local_1a8);
    if (local_298._vptr_Script != (_func_int **)0x0) {
      operator_delete(local_298._vptr_Script);
    }
    pSVar2 = &local_250;
  }
  if (pSVar2->_vptr_Script !=
      (_func_int **)
      ((long)&(pSVar2->script_data_).data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 8U)) {
    operator_delete(pSVar2->_vptr_Script);
  }
  std::__cxx11::string::string((string *)&local_298,fedpeg_script,&local_29a);
  cfd::core::Script::Script((Script *)local_1a8,(string *)&local_298);
  cfd::core::ContractHashUtil::GetContractScript(&local_250,&local_1e0,(Script *)local_1a8);
  cfd::core::Script::~Script((Script *)local_1a8);
  ppuVar1 = (pointer *)((long)&local_298.script_data_.data_ + 8);
  if (local_298._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_298._vptr_Script);
  }
  cfd::ElementsAddressFactory::CreatePegInAddress
            ((Address *)local_1a8,local_254,address_type,&local_250);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&local_298,(Address *)local_1a8);
  local_298.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)cfd::capi::CreateString((string *)&local_298);
  if (local_298._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_298._vptr_Script);
  }
  cfd::core::Script::GetHex_abi_cxx11_((string *)&local_298,&local_1e0);
  local_298.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)cfd::capi::CreateString((string *)&local_298);
  if (local_298._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_298._vptr_Script);
  }
  if (tweaked_fedpeg_script == (char **)0x0) {
    *pegin_address =
         (char *)local_298.script_stack_.
                 super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    *claim_script =
         (char *)local_298.script_stack_.
                 super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    cfd::core::Script::GetHex_abi_cxx11_((string *)&local_298,&local_250);
    local_260 = cfd::capi::CreateString((string *)&local_298);
    if (local_298._vptr_Script != (_func_int **)ppuVar1) {
      operator_delete(local_298._vptr_Script);
    }
    *pegin_address =
         (char *)local_298.script_stack_.
                 super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    *claim_script =
         (char *)local_298.script_stack_.
                 super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    *tweaked_fedpeg_script = local_260;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  cfd::core::Script::~Script(&local_a0);
  local_130._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_b8);
  cfd::core::TapBranch::~TapBranch(&local_130);
  if (local_148 != (pointer)0x0) {
    operator_delete(local_148);
  }
  if (local_160 != (pointer)0x0) {
    operator_delete(local_160);
  }
  if (local_178 != (pointer)0x0) {
    operator_delete(local_178);
  }
  if ((uchar *)local_1a8._16_8_ != local_188) {
    operator_delete((void *)local_1a8._16_8_);
  }
  cfd::core::Script::~Script(&local_250);
  cfd::core::Script::~Script(&local_1e0);
  return 0;
}

Assistant:

int CfdGetPeginAddress(
    void* handle, int mainchain_network_type, const char* fedpeg_script,
    int hash_type, const char* pubkey, const char* redeem_script,
    char** pegin_address, char** claim_script, char** tweaked_fedpeg_script) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_address = nullptr;
  char* work_script = nullptr;
  char* work_fedpeg_script = nullptr;
  try {
    cfd::Initialize();
    if (pegin_address == nullptr) {
      warn(CFD_LOG_SOURCE, "pegin_address is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pegin_address is null.");
    }
    if ((pubkey == nullptr) && (redeem_script == nullptr)) {
      warn(CFD_LOG_SOURCE, "pubkey and script is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey and script is null.");
    }
    if (claim_script == nullptr) {
      warn(CFD_LOG_SOURCE, "claim_script is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. claim_script is null.");
    }
    if (IsEmptyString(fedpeg_script)) {
      warn(CFD_LOG_SOURCE, "fedpeg_script is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. fedpeg_script is null or empty.");
    }

    bool is_bitcoin = false;
    auto net_type = ConvertNetType(mainchain_network_type, &is_bitcoin);
    if (!is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid network type. need mainchain network type.");
    }
    auto addr_type = ConvertHashToAddressType(hash_type);
    Script claim_script_obj;
    if ((pubkey != nullptr) && Pubkey::IsValid(ByteData(pubkey))) {
      claim_script_obj = ScriptUtil::CreateP2wpkhLockingScript(Pubkey(pubkey));
    } else {
      claim_script_obj =
          ScriptUtil::CreateP2wshLockingScript(Script(redeem_script));
    }

    Script tweak_fedpegscript = ContractHashUtil::GetContractScript(
        claim_script_obj, Script(fedpeg_script));
    auto addr = ElementsAddressFactory::CreatePegInAddress(
        net_type, addr_type, tweak_fedpegscript);

    work_address = CreateString(addr.GetAddress());
    work_script = CreateString(claim_script_obj.GetHex());
    if (tweaked_fedpeg_script != nullptr) {
      work_fedpeg_script = CreateString(tweak_fedpegscript.GetHex());
    }

    *pegin_address = work_address;
    *claim_script = work_script;
    if (tweaked_fedpeg_script != nullptr) {
      *tweaked_fedpeg_script = work_fedpeg_script;
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_address, &work_script, &work_fedpeg_script);
  return result;
}